

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.h
# Opt level: O2

QPolygonF * __thiscall
QGraphicsView::mapToScene
          (QPolygonF *__return_storage_ptr__,QGraphicsView *this,int ax,int ay,int w,int h)

{
  long in_FS_OFFSET;
  QRect local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.x2.m_i = ax + -1 + w;
  local_20.y2.m_i = ay + h + -1;
  local_20.x1.m_i = ax;
  local_20.y1.m_i = ay;
  mapToScene(__return_storage_ptr__,this,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QPolygonF QGraphicsView::mapToScene(int ax, int ay, int w, int h) const
{ return mapToScene(QRect(ax, ay, w, h)); }